

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O0

void tcu::anon_unknown_0::EtcDecompressInternal::decompressETC1Block(deUint8 *dst,deUint64 src)

{
  uint uVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  int iVar6;
  uint uVar7;
  deUint32 dVar8;
  int iVar9;
  int iVar10;
  int local_58;
  int modifier;
  deUint32 modifierNdx;
  deUint32 tableNdx;
  int subBlock;
  int dstOffset;
  int y;
  int x;
  int pixelNdx;
  deUint8 dB;
  deUint8 bB;
  deUint8 dG;
  deUint8 bG;
  deUint8 dR;
  deUint8 bR;
  deUint8 baseB [2];
  deUint8 baseG [2];
  deUint8 baseR [2];
  deUint32 table [2];
  int flipBit;
  int diffBit;
  deUint64 src_local;
  deUint8 *dst_local;
  
  dVar2 = getBit(src,0x21);
  dVar3 = getBit(src,0x20);
  _dR = getBits(src,0x25,0x27);
  getBits(src,0x22,0x24);
  if (dVar2 == 0) {
    dVar2 = getBits(src,0x3c,0x3f);
    dG = extend4To8((deUint8)dVar2);
    dVar2 = getBits(src,0x38,0x3b);
    bG = extend4To8((deUint8)dVar2);
    dVar2 = getBits(src,0x34,0x37);
    dB = extend4To8((deUint8)dVar2);
    dVar2 = getBits(src,0x30,0x33);
    bB = extend4To8((deUint8)dVar2);
    dVar2 = getBits(src,0x2c,0x2f);
    pixelNdx._2_1_ = extend4To8((deUint8)dVar2);
    dVar2 = getBits(src,0x28,0x2b);
    pixelNdx._3_1_ = extend4To8((deUint8)dVar2);
  }
  else {
    dVar2 = getBits(src,0x3b,0x3f);
    pixelNdx._1_1_ = (deUint8)dVar2;
    dVar2 = getBits(src,0x38,0x3a);
    pixelNdx._0_1_ = (deUint8)dVar2;
    dVar2 = getBits(src,0x33,0x37);
    dVar8 = getBits(src,0x30,0x32);
    dVar4 = getBits(src,0x2b,0x2f);
    dVar5 = getBits(src,0x28,0x2a);
    dG = extend5To8(pixelNdx._1_1_);
    dB = extend5To8((deUint8)dVar2);
    pixelNdx._2_1_ = extend5To8((deUint8)dVar4);
    bG = extend5Delta3To8(pixelNdx._1_1_,(deUint8)pixelNdx);
    bB = extend5Delta3To8((deUint8)dVar2,(deUint8)dVar8);
    pixelNdx._3_1_ = extend5Delta3To8((deUint8)dVar4,(deUint8)dVar5);
  }
  for (y = 0; y < 0x10; y = y + 1) {
    local_58 = y / 4;
    iVar6 = ((y % 4) * 4 + local_58) * 3;
    if (dVar3 != 0) {
      local_58 = y % 4;
    }
    uVar7 = (uint)(1 < local_58);
    uVar1 = *(uint *)(&dR + (long)(int)uVar7 * 4);
    dVar2 = getBit(src,y + 0x10);
    dVar8 = getBit(src,y);
    iVar10 = decompressETC1Block::modifierTable[uVar1][dVar2 << 1 | dVar8];
    iVar9 = deClamp32((uint)(&dG)[(int)uVar7] + iVar10,0,0xff);
    dst[iVar6] = (deUint8)iVar9;
    iVar9 = deClamp32((uint)(&dB)[(int)uVar7] + iVar10,0,0xff);
    dst[iVar6 + 1] = (deUint8)iVar9;
    iVar10 = deClamp32((uint)*(byte *)((long)&pixelNdx + (long)(int)uVar7 + 2) + iVar10,0,0xff);
    dst[iVar6 + 2] = (deUint8)iVar10;
  }
  return;
}

Assistant:

void decompressETC1Block (deUint8 dst[ETC2_UNCOMPRESSED_BLOCK_SIZE_RGB8], deUint64 src)
{
	const int		diffBit		= (int)getBit(src, 33);
	const int		flipBit		= (int)getBit(src, 32);
	const deUint32	table[2]	= { getBits(src, 37, 39), getBits(src, 34, 36) };
	deUint8			baseR[2];
	deUint8			baseG[2];
	deUint8			baseB[2];

	if (diffBit == 0)
	{
		// Individual mode.
		baseR[0] = extend4To8((deUint8)getBits(src, 60, 63));
		baseR[1] = extend4To8((deUint8)getBits(src, 56, 59));
		baseG[0] = extend4To8((deUint8)getBits(src, 52, 55));
		baseG[1] = extend4To8((deUint8)getBits(src, 48, 51));
		baseB[0] = extend4To8((deUint8)getBits(src, 44, 47));
		baseB[1] = extend4To8((deUint8)getBits(src, 40, 43));
	}
	else
	{
		// Differential mode (diffBit == 1).
		deUint8 bR = (deUint8)getBits(src, 59, 63); // 5b
		deUint8 dR = (deUint8)getBits(src, 56, 58); // 3b
		deUint8 bG = (deUint8)getBits(src, 51, 55);
		deUint8 dG = (deUint8)getBits(src, 48, 50);
		deUint8 bB = (deUint8)getBits(src, 43, 47);
		deUint8 dB = (deUint8)getBits(src, 40, 42);

		baseR[0] = extend5To8(bR);
		baseG[0] = extend5To8(bG);
		baseB[0] = extend5To8(bB);

		baseR[1] = extend5Delta3To8(bR, dR);
		baseG[1] = extend5Delta3To8(bG, dG);
		baseB[1] = extend5Delta3To8(bB, dB);
	}

	static const int modifierTable[8][4] =
	{
	//	  00   01   10    11
		{  2,   8,  -2,   -8 },
		{  5,  17,  -5,  -17 },
		{  9,  29,  -9,  -29 },
		{ 13,  42, -13,  -42 },
		{ 18,  60, -18,  -60 },
		{ 24,  80, -24,  -80 },
		{ 33, 106, -33, -106 },
		{ 47, 183, -47, -183 }
	};

	// Write final pixels.
	for (int pixelNdx = 0; pixelNdx < ETC2_BLOCK_HEIGHT*ETC2_BLOCK_WIDTH; pixelNdx++)
	{
		const int		x				= pixelNdx / ETC2_BLOCK_HEIGHT;
		const int		y				= pixelNdx % ETC2_BLOCK_HEIGHT;
		const int		dstOffset		= (y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_RGB8;
		const int		subBlock		= ((flipBit ? y : x) >= 2) ? 1 : 0;
		const deUint32	tableNdx		= table[subBlock];
		const deUint32	modifierNdx		= (getBit(src, 16+pixelNdx) << 1) | getBit(src, pixelNdx);
		const int		modifier		= modifierTable[tableNdx][modifierNdx];

		dst[dstOffset+0] = (deUint8)deClamp32((int)baseR[subBlock] + modifier, 0, 255);
		dst[dstOffset+1] = (deUint8)deClamp32((int)baseG[subBlock] + modifier, 0, 255);
		dst[dstOffset+2] = (deUint8)deClamp32((int)baseB[subBlock] + modifier, 0, 255);
	}
}